

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_short>
          (TryCast *this,string_t input,uint16_t *result,bool strict)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  ushort uVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  idx_t iVar14;
  ulong uVar15;
  short sVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  IntegerCastData<short> local_7a;
  IntegerDecimalCastData<unsigned_short> local_78;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = input.value._0_8_;
  lVar11 = input.value._0_8_;
  if ((uint)this < 0xd) {
    lVar11 = (long)&local_40 + 4;
  }
  if ((uint)this == 0) {
    return false;
  }
  uVar15 = (ulong)this & 0xffffffff;
  uVar3 = 0;
  do {
    bVar21 = *(byte *)(lVar11 + uVar3);
    bVar5 = (byte)result;
    if ((4 < bVar21 - 9) && (bVar21 != 0x20)) {
      if (bVar21 == 0x2d) {
        uVar12 = uVar15 - uVar3;
        uVar17 = 1;
        goto LAB_01247b2f;
      }
      if ((uVar15 - 1 == uVar3) || (bVar21 != 0x30)) {
        if ((bVar21 == 0x2b & bVar5) != 0) break;
        uVar12 = (ulong)(bVar21 == 0x2b);
      }
      else {
        bVar21 = *(byte *)(lVar11 + 1 + uVar3);
        if (bVar21 < 0x62) {
          if (bVar21 == 0x42) {
LAB_01247e21:
            uVar12 = ~uVar3 + uVar15;
            if (1 < uVar12) {
              uVar17 = 1;
              uVar6 = 0;
              goto LAB_01247e3c;
            }
            break;
          }
          if (bVar21 == 0x58) {
LAB_01247d00:
            uVar12 = ~uVar3 + uVar15;
            if (1 < uVar12) {
              uVar17 = 1;
              uVar20 = 0;
              goto LAB_01247d25;
            }
            break;
          }
        }
        else {
          if (bVar21 == 0x62) goto LAB_01247e21;
          if (bVar21 == 0x78) goto LAB_01247d00;
        }
        if (((byte)(bVar21 - 0x30) < 10 & bVar5) != 0) break;
        uVar12 = 0;
      }
      uVar17 = uVar15 - uVar3;
      if (uVar17 <= uVar12) {
        uVar6 = 0;
        uVar24 = 1;
        goto LAB_01247fd6;
      }
      uVar6 = 0;
      uVar7 = uVar12;
      goto LAB_01247c4e;
    }
    uVar3 = uVar3 + 1;
  } while (uVar15 != uVar3);
  goto LAB_01248014;
  while (lVar19 = lVar11 + uVar17, uVar17 = uVar17 + 1, *(char *)(uVar3 + lVar19) == '0') {
LAB_01247b2f:
    if (uVar12 <= uVar17) {
      if (uVar15 - 1 != uVar3) {
        uVar6 = 0;
        uVar17 = 1;
        goto LAB_01247ba8;
      }
      break;
    }
  }
  goto LAB_01248014;
  while( true ) {
    uVar6 = uVar6 * 10 - (ushort)(byte)(bVar21 - 0x30);
    uVar24 = uVar12;
    if (~uVar17 + uVar15 == uVar3) break;
    if (*(char *)(uVar3 + 1 + lVar19) == '_' && bVar5 == 0) {
      if (((uVar15 - uVar17) - 2 == uVar3) ||
         (uVar24 = uVar17 + 2, 9 < (byte)(*(char *)(uVar3 + lVar11 + uVar24) - 0x30U)))
      goto LAB_01248014;
    }
    else {
      uVar24 = uVar17 + 1;
    }
    uVar17 = uVar24;
    if (uVar12 <= uVar24) break;
LAB_01247ba8:
    lVar19 = uVar17 + lVar11;
    bVar21 = *(byte *)(uVar3 + lVar19);
    if (9 < (byte)(bVar21 - 0x30)) {
      uVar7 = uVar17;
      if (bVar21 == 0x2e) {
        if (bVar5 != 0) goto LAB_01248014;
        uVar7 = uVar17 + 1;
        if (uVar12 <= uVar7) {
          if (uVar17 < 2) goto LAB_01248014;
          goto LAB_01247fdb;
        }
        if ((uVar17 < 2) || (bVar21 = *(byte *)(uVar3 + 1 + lVar19), (byte)(bVar21 - 0x30) < 10))
        goto LAB_01248014;
      }
      if ((4 < bVar21 - 9) && (bVar21 != 0x20)) goto LAB_01248014;
      uVar7 = uVar7 + 1;
      uVar24 = uVar7;
      if (uVar7 < uVar12) goto LAB_01247f2e;
      break;
    }
  }
  goto LAB_01247f59;
  while (uVar7 = uVar7 + 1, uVar24 = uVar12, uVar12 != uVar7) {
LAB_01247f2e:
    bVar21 = *(byte *)(uVar3 + lVar11 + uVar7);
    if ((4 < bVar21 - 9) && (bVar21 != 0x20)) goto LAB_01248014;
  }
LAB_01247f59:
  if (1 < uVar24) goto LAB_01247fdb;
  goto LAB_01248014;
  while( true ) {
    uVar7 = uVar12;
    if ((uVar15 - uVar17) - 2 != uVar3) {
      if (*(char *)(uVar3 + 2 + lVar19) == '_') {
        if (((uVar15 - uVar17) - 3 == uVar3) || ((*(byte *)(uVar3 + 3 + lVar19) & 0xfe) != 0x30))
        goto LAB_01248014;
        uVar7 = uVar17 + 2;
      }
      else {
        uVar7 = uVar17 + 1;
      }
    }
    uVar17 = uVar7;
    if ((short)uVar6 < 0) goto LAB_01248014;
    uVar6 = sVar16 + uVar6 * 2;
    if (uVar12 <= uVar17) break;
LAB_01247e3c:
    lVar19 = uVar17 + lVar11;
    cVar1 = *(char *)(uVar3 + 1 + lVar19);
    if (cVar1 == '0') {
      sVar16 = 0;
    }
    else {
      if (cVar1 != '1') goto LAB_01248014;
      sVar16 = 1;
    }
  }
  goto LAB_01247fdb;
  while( true ) {
    uVar17 = uVar7;
    if ((uVar18 >> 4 & 0xf ^ 0xfff) < (uVar20 & 0xffff)) goto LAB_01248014;
    uVar20 = uVar20 * 0x10 + (uVar18 & 0xff);
    uVar6 = (ushort)uVar20;
    if (uVar12 <= uVar17) break;
LAB_01247d25:
    lVar19 = uVar17 + lVar11;
    bVar21 = *(byte *)(uVar3 + 1 + lVar19);
    bVar8 = bVar21 | 0x20;
    if (0x19 < (byte)(bVar21 + 0xbf)) {
      bVar8 = bVar21;
    }
    uVar18 = bVar8 - 0x30;
    if ((byte)(bVar8 + 0x9f) < 6 || (byte)uVar18 < 10) {
      uVar22 = bVar8 - 0x57;
      if (bVar8 < 0x61) {
        uVar22 = uVar18;
      }
      uVar18 = uVar22 & 0xff;
    }
    else if (5 < (byte)(bVar8 + 0xbf)) goto LAB_01248014;
    uVar7 = uVar12;
    if ((uVar15 - uVar17) - 2 != uVar3) {
      if (*(char *)(uVar3 + 2 + lVar19) == '_') {
        if ((uVar15 - uVar17) - 3 == uVar3) goto LAB_01248014;
        bVar21 = *(byte *)(uVar3 + 3 + lVar19);
        uVar7 = uVar17 + 2;
        if ((9 < (byte)(bVar21 - 0x30)) &&
           ((uVar22 = bVar21 - 0x41, 0x25 < uVar22 ||
            ((0x3f0000003fU >> ((ulong)uVar22 & 0x3f) & 1) == 0)))) goto LAB_01248014;
      }
      else {
        uVar7 = uVar17 + 1;
      }
    }
  }
  goto LAB_01247fdb;
  while( true ) {
    if ((ushort)~(ushort)bVar8 / 10 < uVar6) goto LAB_01248014;
    uVar6 = (ushort)bVar8 + uVar6 * 10;
    uVar24 = uVar17;
    if (~uVar7 + uVar15 == uVar3) break;
    if (*(char *)(uVar3 + 1 + lVar19) == '_' && bVar5 == 0) {
      if (((uVar15 - uVar7) - 2 == uVar3) ||
         (uVar7 = uVar7 + 2, 9 < (byte)(*(char *)(uVar3 + lVar11 + uVar7) - 0x30U)))
      goto LAB_01248014;
    }
    else {
      uVar7 = uVar7 + 1;
    }
    uVar24 = uVar7;
    if (uVar17 <= uVar7) break;
LAB_01247c4e:
    lVar19 = uVar7 + lVar11;
    bVar21 = *(byte *)(uVar3 + lVar19);
    bVar8 = bVar21 - 0x30;
    if (9 < bVar8) {
      uVar24 = uVar7;
      if (bVar21 == 0x2e) {
        if (bVar5 != 0) goto LAB_01248014;
        uVar24 = uVar7 + 1;
        if (uVar17 <= uVar24) {
          if (uVar7 <= uVar12) goto LAB_01248014;
          break;
        }
        if ((uVar7 <= uVar12) ||
           (bVar21 = *(byte *)(uVar3 + 1 + lVar19), (byte)(bVar21 - 0x30) < 10)) goto LAB_01248014;
      }
      if ((4 < bVar21 - 9) && (bVar21 != 0x20)) goto LAB_01248014;
      uVar7 = uVar24 + 1;
      uVar24 = uVar7;
      if (uVar7 < uVar17) goto LAB_01247faf;
      break;
    }
  }
  goto LAB_01247fd6;
LAB_012485a0:
  local_48 = uVar10;
  local_58 = uVar24 + lVar11;
  bVar21 = *(byte *)(uVar3 + local_58);
  bVar8 = bVar21 - 0x30;
  if (9 < bVar8) {
    local_78._16_8_ = local_48 & 0xffff;
    if (uVar24 <= local_50 && uVar7 <= uVar17) {
      return false;
    }
LAB_012487bf:
    uVar20 = (uint)bVar21;
    if (bVar21 < 0x20) {
      if (4 < uVar20 - 9) {
        return false;
      }
LAB_012487d5:
      uVar24 = uVar24 + 1;
      uVar23 = uVar24;
      if (uVar24 < uVar12) {
        do {
          bVar21 = *(byte *)(uVar3 + lVar11 + uVar24);
          if ((4 < bVar21 - 9) && (bVar21 != 0x20)) {
            return false;
          }
          uVar24 = uVar24 + 1;
          uVar23 = uVar12;
        } while (uVar12 != uVar24);
      }
      goto LAB_01248666;
    }
    if ((bVar21 != 0x65) && (uVar20 != 0x45)) {
      if (uVar20 != 0x20) {
        return false;
      }
      goto LAB_012487d5;
    }
    if (uVar24 == uVar17 || bVar5 != 0) {
      return false;
    }
    if (uVar12 <= uVar24 + 1) {
      return false;
    }
    local_7a.result = 0;
    pcVar13 = (char *)(uVar3 + lVar11 + uVar24 + 1);
    iVar14 = ~uVar3 + (uVar15 - uVar24);
    if (*pcVar13 == '-') {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar13,iVar14,&local_7a,false);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar13,iVar14,&local_7a,false);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = IntegerDecimalCastOperation::
            HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                      (&local_78,local_7a.result);
    goto LAB_01248430;
  }
  uVar10 = local_48;
  uVar20 = (uint)local_60;
  if (local_78.decimal <= (long)(((ulong)bVar8 ^ 0x7ffffffffffffffe) / 10)) {
    local_78.decimal = local_78.decimal * 10 + (ulong)bVar8;
    uVar10 = (ulong)((uint)local_60 + 1);
    uVar20 = (uint)local_60 + 1;
  }
  uVar23 = uVar12;
  if (~uVar24 + uVar15 != uVar3) goto code_r0x01248604;
  goto LAB_01248870;
code_r0x01248604:
  if (*(char *)(uVar3 + 1 + local_58) == '_') {
    if ((uVar15 - uVar24) - 2 == uVar3) {
      return false;
    }
    uVar24 = uVar24 + 2;
    if (9 < (byte)(*(char *)(uVar3 + lVar11 + uVar24) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar24 = uVar24 + 1;
  }
  local_60 = CONCAT44(local_60._4_4_,uVar20);
  uVar23 = uVar24;
  if (uVar12 <= uVar24) goto LAB_01248870;
  goto LAB_012485a0;
LAB_01248870:
  local_78._16_8_ = uVar10 & 0xffff;
LAB_0124887b:
  if ((uVar7 <= uVar17) && (uVar23 <= local_50)) {
    return false;
  }
  goto LAB_01248666;
LAB_01248488:
  uVar9 = uVar10;
  bVar21 = *(byte *)(uVar3 + uVar7 + lVar11);
  bVar8 = bVar21 - 0x30;
  local_58 = uVar24;
  if (9 < bVar8) {
    local_78._16_8_ = uVar9 & 0xffff;
    if (uVar7 <= uVar24 && uVar17 < 2) {
      return false;
    }
LAB_012486b7:
    uVar20 = (uint)bVar21;
    if (0x1f < bVar21) {
      if ((bVar21 != 0x65) && (uVar20 != 0x45)) {
        if (uVar20 != 0x20) {
          return false;
        }
        goto LAB_012486cd;
      }
      if (uVar7 == 1 || bVar5 != 0) {
        return false;
      }
      if (uVar12 <= uVar7 + 1) {
        return false;
      }
      local_7a.result = 0;
      pcVar13 = (char *)(uVar3 + lVar11 + uVar7 + 1);
      iVar14 = ~uVar3 + (uVar15 - uVar7);
      if (*pcVar13 == '-') {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar13,iVar14,&local_7a,false);
      }
      else {
        bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar13,iVar14,&local_7a,false);
      }
      if (bVar2 == false) {
        return false;
      }
      bVar2 = IntegerDecimalCastOperation::
              HandleExponent<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                        (&local_78,local_7a.result);
      goto LAB_01248430;
    }
    if (4 < uVar20 - 9) {
      return false;
    }
LAB_012486cd:
    uVar7 = uVar7 + 1;
    uVar23 = uVar7;
    if (uVar7 < uVar12) {
      do {
        bVar21 = *(byte *)(uVar3 + lVar11 + uVar7);
        if ((4 < bVar21 - 9) && (bVar21 != 0x20)) {
          return false;
        }
        uVar7 = uVar7 + 1;
        uVar23 = uVar12;
      } while (uVar12 != uVar7);
    }
    goto LAB_0124853c;
  }
  uVar10 = uVar9;
  if (local_78.decimal <= (long)(((ulong)bVar8 ^ 0x7ffffffffffffffe) / 10)) {
    uVar20 = uVar20 + 1;
    local_78.decimal = local_78.decimal * 10 + (ulong)bVar8;
    uVar10 = (ulong)uVar20;
  }
  uVar23 = uVar12;
  local_60 = uVar9;
  if (~uVar7 + uVar15 != uVar3) goto code_r0x012484e7;
  goto LAB_01248770;
code_r0x012484e7:
  if (*(char *)(uVar3 + 1 + uVar7 + lVar11) == '_') {
    if ((uVar15 - uVar7) - 2 == uVar3) {
      return false;
    }
    uVar7 = uVar7 + 2;
    if (9 < (byte)(*(char *)(uVar3 + lVar11 + uVar7) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar7 = uVar7 + 1;
  }
  uVar23 = uVar7;
  if (uVar12 <= uVar7) goto LAB_01248770;
  goto LAB_01248488;
LAB_01248770:
  local_78._16_8_ = uVar10 & 0xffff;
LAB_0124877f:
  if ((uVar17 < 2) && (uVar23 <= uVar24)) {
    return false;
  }
  goto LAB_0124853c;
  while (uVar7 = uVar7 + 1, uVar24 = uVar17, uVar17 != uVar7) {
LAB_01247faf:
    bVar21 = *(byte *)(uVar3 + lVar11 + uVar7);
    if ((4 < bVar21 - 9) && (bVar21 != 0x20)) goto LAB_01248014;
  }
LAB_01247fd6:
  if (uVar12 < uVar24) {
LAB_01247fdb:
    *input.value._8_8_ = uVar6;
    return true;
  }
LAB_01248014:
  uVar3 = 0;
  while ((bVar21 = *(byte *)(lVar11 + uVar3), bVar21 - 9 < 5 || (bVar21 == 0x20))) {
    uVar3 = uVar3 + 1;
    if (uVar15 == uVar3) {
      return false;
    }
  }
  local_78.result = 0;
  local_78.decimal = 0;
  local_78._16_8_ = 0;
  uVar12 = uVar15 - uVar3;
  local_40 = this;
  if (bVar21 == 0x2d) {
    lVar19 = 1;
    while (uVar12 + (uVar12 == 0) != lVar19) {
      lVar4 = lVar11 + lVar19;
      lVar19 = lVar19 + 1;
      if (*(char *)(uVar3 + lVar4) != '0') {
        return false;
      }
    }
    if (uVar15 - 1 == uVar3) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>
                (&local_78);
      return false;
    }
    uVar17 = 1;
    local_78.result = 0;
    do {
      bVar21 = *(byte *)(uVar3 + uVar17 + lVar11);
      bVar8 = bVar21 - 0x30;
      if (9 < bVar8) {
        uVar7 = uVar17;
        if (bVar21 != 0x2e) goto LAB_012486b7;
        if (bVar5 != 0) {
          return false;
        }
        uVar24 = uVar17 + 1;
        uVar23 = uVar24;
        if (uVar12 <= uVar24) goto LAB_0124877f;
        local_78.decimal = 0;
        uVar20 = 0;
        uVar10 = 0;
        uVar7 = uVar24;
        goto LAB_01248488;
      }
      uVar7 = (0x8000000000000000 - (ulong)bVar8) / 10;
      if (SBORROW8(local_78.result,-uVar7) != (long)(local_78.result + uVar7) < 0) {
        return false;
      }
      local_78.result = local_78.result * 10 - (ulong)bVar8;
      uVar23 = uVar12;
      if (~uVar17 + uVar15 == uVar3) break;
      if (*(char *)(uVar3 + 1 + uVar17 + lVar11) == '_' && bVar5 == 0) {
        if ((uVar15 - uVar17) - 2 == uVar3) {
          return false;
        }
        uVar17 = uVar17 + 2;
        if (9 < (byte)(*(char *)(uVar3 + lVar11 + uVar17) - 0x30U)) {
          return false;
        }
      }
      else {
        uVar17 = uVar17 + 1;
      }
      uVar23 = uVar17;
    } while (uVar17 < uVar12);
LAB_0124853c:
    bVar2 = IntegerDecimalCastOperation::
            Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,true>(&local_78);
    if (!bVar2) {
      return false;
    }
    if (uVar23 < 2) {
      return false;
    }
    goto LAB_01248685;
  }
  if ((uVar15 - 1 == uVar3) || (bVar21 != 0x30)) {
    if ((bVar21 == 0x2b & bVar5) != 0) {
      return false;
    }
    uVar17 = (ulong)(bVar21 == 0x2b);
LAB_012480ef:
    if (uVar12 <= uVar17) goto LAB_01248439;
    local_78.result = 0;
    uVar7 = uVar17;
    do {
      bVar21 = *(byte *)(uVar3 + uVar7 + lVar11);
      bVar8 = bVar21 - 0x30;
      if (9 < bVar8) {
        uVar24 = uVar7;
        if (bVar21 != 0x2e) goto LAB_012487bf;
        if (bVar5 != 0) {
          return false;
        }
        local_50 = uVar7 + 1;
        uVar23 = local_50;
        if (uVar12 <= local_50) goto LAB_0124887b;
        local_78.decimal = 0;
        local_60 = local_60 & 0xffffffff00000000;
        uVar10 = 0;
        uVar24 = local_50;
        goto LAB_012485a0;
      }
      if ((long)(((ulong)bVar8 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar8;
      uVar23 = uVar12;
      if (~uVar7 + uVar15 == uVar3) break;
      if (*(char *)(uVar3 + 1 + uVar7 + lVar11) == '_' && bVar5 == 0) {
        if ((uVar15 - uVar7) - 2 == uVar3) {
          return false;
        }
        uVar7 = uVar7 + 2;
        if (9 < (byte)(*(char *)(uVar3 + lVar11 + uVar7) - 0x30U)) {
          return false;
        }
      }
      else {
        uVar7 = uVar7 + 1;
      }
      uVar23 = uVar7;
    } while (uVar7 < uVar12);
LAB_01248666:
    bVar2 = IntegerDecimalCastOperation::
            Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_78);
    if (!bVar2) {
      return false;
    }
    if (uVar23 <= uVar17) {
      return false;
    }
    goto LAB_01248685;
  }
  bVar21 = *(byte *)(lVar11 + 1 + uVar3);
  if (bVar21 < 0x62) {
    if (bVar21 != 0x42) {
      if (bVar21 != 0x58) {
LAB_012480ae:
        if (((byte)(bVar21 - 0x30) < 10 & bVar5) != 0) {
          return false;
        }
        uVar17 = 0;
        goto LAB_012480ef;
      }
      goto LAB_01248272;
    }
LAB_01248394:
    uVar12 = ~uVar3 + uVar15;
    if (uVar12 < 2) goto LAB_01248439;
    uVar17 = 1;
    local_78.result = 0;
    do {
      lVar19 = uVar17 + lVar11;
      cVar1 = *(char *)(uVar3 + 1 + lVar19);
      lVar4 = 0;
      if (cVar1 != '0') {
        if (cVar1 != '1') {
          return false;
        }
        lVar4 = 1;
      }
      uVar7 = uVar12;
      if ((uVar15 - uVar17) - 2 != uVar3) {
        if (*(char *)(uVar3 + 2 + lVar19) == '_') {
          if ((uVar15 - uVar17) - 3 == uVar3) {
            return false;
          }
          if ((*(byte *)(uVar3 + 3 + lVar19) & 0xfe) != 0x30) {
            return false;
          }
          uVar7 = uVar17 + 2;
        }
        else {
          uVar7 = uVar17 + 1;
        }
      }
      uVar17 = uVar7;
      if (0x3fffffffffffffff < local_78.result) {
        return false;
      }
      local_78.result = lVar4 + local_78.result * 2;
    } while (uVar17 < uVar12);
  }
  else {
    if (bVar21 == 0x62) goto LAB_01248394;
    if (bVar21 != 0x78) goto LAB_012480ae;
LAB_01248272:
    uVar12 = ~uVar3 + uVar15;
    if (uVar12 < 2) {
LAB_01248439:
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>
                (&local_78);
      return false;
    }
    uVar17 = 1;
    local_78.result = 0;
    do {
      lVar19 = uVar17 + lVar11;
      bVar21 = *(byte *)(uVar3 + 1 + lVar19);
      bVar5 = bVar21 | 0x20;
      if (0x19 < (byte)(bVar21 + 0xbf)) {
        bVar5 = bVar21;
      }
      bVar21 = bVar5 - 0x30;
      if ((byte)(bVar5 + 0x9f) < 6 || bVar21 < 10) {
        bVar8 = bVar5 + 0xa9;
        if (bVar5 < 0x61) {
          bVar8 = bVar21;
        }
      }
      else {
        bVar8 = bVar21;
        if (5 < (byte)(bVar5 + 0xbf)) {
          return false;
        }
      }
      uVar7 = uVar12;
      if ((uVar15 - uVar17) - 2 != uVar3) {
        if (*(char *)(uVar3 + 2 + lVar19) == '_') {
          if ((uVar15 - uVar17) - 3 == uVar3) {
            return false;
          }
          bVar21 = *(byte *)(uVar3 + 3 + lVar19);
          uVar7 = uVar17 + 2;
          if (9 < (byte)(bVar21 - 0x30)) {
            uVar20 = bVar21 - 0x41;
            if (0x25 < uVar20) {
              return false;
            }
            if ((0x3f0000003fU >> ((ulong)uVar20 & 0x3f) & 1) == 0) {
              return false;
            }
          }
        }
        else {
          uVar7 = uVar17 + 1;
        }
      }
      uVar17 = uVar7;
      if ((long)((ulong)(bVar8 >> 4) ^ 0x7ffffffffffffff) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 0x10 + (ulong)bVar8;
    } while (uVar17 < uVar12);
  }
  bVar2 = IntegerDecimalCastOperation::
          Finalize<duckdb::IntegerDecimalCastData<unsigned_short>,false>(&local_78);
LAB_01248430:
  if (bVar2 == false) {
    return false;
  }
LAB_01248685:
  *input.value._8_8_ = (ushort)local_78.result;
  return true;
}

Assistant:

bool TryCast::Operation(bool input, uint16_t &result, bool strict) {
	return NumericTryCast::Operation<bool, uint16_t>(input, result, strict);
}